

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen7TextureCalc::FillTex3D
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t uVar5;
  GMM_PLATFORM_INFO *pGVar6;
  byte bVar7;
  uint local_a8;
  uint32_t local_a4;
  uint local_a0;
  uint32_t local_9c;
  uint32_t local_98;
  uint local_94;
  __GMM_PLATFORM_RESOURCE *pPlatformResource;
  GMM_STATUS Status;
  uint uStack_68;
  bool SeparateStencil;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t uStack_58;
  uint8_t Compress;
  uint32_t WidthBytesPhysical;
  uint32_t Total3DHeight;
  uint32_t UnitAlignWidth;
  uint32_t ThisRowPitch;
  uint32_t RenderPitch;
  uint32_t MipWidth;
  uint32_t MipsInThisRow;
  uint32_t i;
  uint32_t Width;
  uint32_t Height;
  uint32_t Depth;
  uint32_t BitsPerPixel;
  uint32_t AlignedMipWidth;
  __GMM_BUFFER_TYPE *pRestrictions_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen7TextureCalc *this_local;
  
  UnitAlignWidth = 0;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    _BitsPerPixel = pRestrictions;
    pRestrictions_local = (__GMM_BUFFER_TYPE *)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pGVar6 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    Height = pRestrictions_local->RenderPitchAlignment;
    i = pRestrictions_local->MinHeight;
    MipsInThisRow = (uint32_t)pRestrictions_local->MinAllocationSize;
    Width = *(uint32_t *)&pRestrictions_local->field_0x2c;
    WidthBytesPhysical = pRestrictions_local->MaxDepth;
    CompressWidth._3_1_ =
         GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,
                         pRestrictions_local->PitchAlignment);
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pRestrictions_local->PitchAlignment,
               &stack0xffffffffffffff98,&CompressDepth,&Status);
    uVar1 = pRestrictions_local->LockPitchAlignment;
    ThisRowPitch = MipsInThisRow;
    Depth = (MipsInThisRow + (WidthBytesPhysical - 1)) -
            (MipsInThisRow + (WidthBytesPhysical - 1) & WidthBytesPhysical - 1);
    for (MipWidth = 0; MipWidth <= (uint)pRestrictions_local->MinWidth; MipWidth = MipWidth + 1) {
      if (CompressWidth._3_1_ == '\0') {
        if ((uVar1 >> 0x1d & 1) == 0) {
          uVar2._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar2._4_4_ = pRestrictions_local->MinPitch;
          if ((uVar2 >> 1 & 1) != 0) {
            uVar3._0_4_ = pRestrictions_local->LockPitchAlignment;
            uVar3._4_4_ = pRestrictions_local->MinPitch;
            if ((uVar3 >> 0x29 & 1) == 0) {
              uVar4._0_4_ = pRestrictions_local->LockPitchAlignment;
              uVar4._4_4_ = pRestrictions_local->MinPitch;
              if ((uVar4 >> 0x28 & 1) != 0) {
                if (Height == 0x20) {
                  Depth = Depth >> 4;
                }
                else if (Height == 0x40) {
                  Depth = Depth >> 3;
                }
                else if (Height == 0x80) {
                  Depth = Depth >> 2;
                }
              }
            }
            else if (Height == 0x20) {
              Depth = Depth >> 3;
            }
            else if (Height == 0x40) {
              Depth = Depth >> 2;
            }
            else if (Height == 0x80) {
              Depth = Depth >> 1;
            }
          }
        }
        else {
          Depth = Depth << 1;
        }
      }
      else {
        Depth = Depth / uStack_68;
      }
      local_9c = GFX_2_TO_POWER_OF(MipWidth);
      bVar7 = (byte)MipWidth;
      if (Width >> (bVar7 & 0x1f) == 0) {
        local_94 = 1;
      }
      else {
        local_94 = Width >> (bVar7 & 0x1f);
      }
      if (local_94 < local_9c) {
        if (Width >> (bVar7 & 0x1f) == 0) {
          local_98 = 1;
        }
        else {
          local_98 = Width >> (bVar7 & 0x1f);
        }
        local_9c = local_98;
      }
      RenderPitch = local_9c;
      Total3DHeight = Depth * local_9c;
      CompressHeight = Total3DHeight * Height >> 3;
      if (UnitAlignWidth < CompressHeight) {
        UnitAlignWidth = CompressHeight;
      }
      local_a0 = ThisRowPitch >> 1;
      if (local_a0 < 2) {
        local_a0 = 1;
      }
      ThisRowPitch = local_a0;
      Depth = (local_a0 + (WidthBytesPhysical - 1)) -
              (local_a0 + (WidthBytesPhysical - 1) & WidthBytesPhysical - 1);
    }
    if (_BitsPerPixel->MinPitch < UnitAlignWidth) {
      local_a4 = UnitAlignWidth;
    }
    else {
      local_a4 = _BitsPerPixel->MinPitch;
    }
    CompressHeight =
         (local_a4 + (_BitsPerPixel->PitchAlignment - 1)) -
         (local_a4 + (_BitsPerPixel->PitchAlignment - 1) & _BitsPerPixel->PitchAlignment - 1);
    uStack_58 = GetTotal3DHeight(this,(GMM_TEXTURE_INFO *)pRestrictions_local);
    if (pGVar6->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalSize != 0) {
      uStack_58 = (uStack_58 +
                  (pGVar6->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight - 1)) -
                  (uStack_58 +
                   (pGVar6->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight - 1) &
                  pGVar6->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight - 1);
      CompressHeight =
           (CompressHeight +
           (pGVar6->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth - 1)) -
           (CompressHeight +
            (pGVar6->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth - 1) &
           pGVar6->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth - 1);
    }
    uVar5 = GmmIsYUVPacked(pRestrictions_local->PitchAlignment);
    if (((uVar5 != '\0') || (pRestrictions_local->RenderPitchAlignment == 0x60)) ||
       (pRestrictions_local->RenderPitchAlignment == 0x30)) {
      if (CompressHeight == 0) {
        local_a8 = 0x10;
      }
      else {
        local_a8 = (CompressHeight + 0xf) / CompressHeight;
      }
      uStack_58 = local_a8 + 1 + uStack_58;
    }
    uStack_58 = (uStack_58 + 1) - (uStack_58 + 1 & 1);
    this_local._4_4_ =
         GmmTextureCalc::FillTexPitchAndSize
                   (&this->super_GmmTextureCalc,(GMM_TEXTURE_INFO *)pRestrictions_local,
                    (ulong)CompressHeight,uStack_58,_BitsPerPixel);
    if (this_local._4_4_ == GMM_SUCCESS) {
      Fill3DTexOffsetAddress(this,(GMM_TEXTURE_INFO *)pRestrictions_local);
    }
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen7TextureCalc::FillTex3D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   AlignedMipWidth;
    uint32_t   BitsPerPixel;
    uint32_t   Depth, Height, Width;
    uint32_t   i, MipsInThisRow, MipWidth;
    uint32_t   RenderPitch = 0, ThisRowPitch;
    uint32_t   UnitAlignWidth;
    uint32_t   Total3DHeight;
    uint32_t   WidthBytesPhysical;
    uint8_t    Compress;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;
    bool       SeparateStencil;
    GMM_STATUS Status;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    const __GMM_PLATFORM_RESOURCE *pPlatformResource = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    Height       = pTexInfo->BaseHeight;
    Width        = GFX_ULONG_CAST(pTexInfo->BaseWidth);
    Depth        = pTexInfo->Depth;

    // Align before we compress
    UnitAlignWidth = pTexInfo->Alignment.HAlign;
    Compress       = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);
    SeparateStencil = pTexInfo->Flags.Gpu.SeparateStencil ? true : false;

    // Unaligned MipMap dimension variables
    MipWidth = Width;

    // Aligned MipMap dimension variables
    AlignedMipWidth = GFX_ALIGN(MipWidth, UnitAlignWidth);

    // Calculate the render pitch exactly the same way we do the
    // offset for each Mip level
    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        if(Compress)
        {
            // If there is compression, compress after the alignment at each level
            AlignedMipWidth /= CompressWidth;
        }
        else if(SeparateStencil)
        {
            AlignedMipWidth *= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS)
        {
            if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
            {
                switch(BitsPerPixel)
                {
                    case 32:
                        AlignedMipWidth /= 8;
                        break;
                    case 64:
                        AlignedMipWidth /= 4;
                        break;
                    case 128:
                        AlignedMipWidth /= 2;
                        break;
                    default:
                        __GMM_ASSERT(0);
                }
            }
            else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
            {
                switch(BitsPerPixel)
                {
                    case 32:
                        AlignedMipWidth /= 16;
                        break;
                    case 64:
                        AlignedMipWidth /= 8;
                        break;
                    case 128:
                        AlignedMipWidth /= 4;
                        break;
                    default:
                        __GMM_ASSERT(0);
                }
            }
        }

        // See how many mip can fit in one row
        MipsInThisRow = GFX_2_TO_POWER_OF(i);

        // LOD planes may be less than MipsInThisRow, take the smaller value for pitch
        MipsInThisRow = GFX_MIN(GFX_MAX(1, (Depth >> i)), MipsInThisRow);
        ThisRowPitch  = AlignedMipWidth * MipsInThisRow;

        // Default pitch
        WidthBytesPhysical = ThisRowPitch * BitsPerPixel >> 3;

        if(RenderPitch < WidthBytesPhysical)
        {
            RenderPitch = WidthBytesPhysical;
        }

        MipWidth >>= 1;
        // Clamp such that mip width is at least 1
        MipWidth        = GFX_MAX(MipWidth, 1);
        AlignedMipWidth = GFX_ALIGN(MipWidth, UnitAlignWidth);
    }

    WidthBytesPhysical = RenderPitch;

    // Make sure the pitch satisfy linear min pitch requirment
    WidthBytesPhysical = GFX_MAX(WidthBytesPhysical,
                                 pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                   pRestrictions->PitchAlignment);

    // Get Total height for the entire 3D texture
    Total3DHeight = GetTotal3DHeight(pTexInfo);

    if(GMM_IS_TILED(pPlatformResource->TileInfo[pTexInfo->TileMode]))
    {
        // Align to tile boundary
        Total3DHeight = GFX_ALIGN(Total3DHeight,
                                  pPlatformResource->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                       pPlatformResource->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
    }

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        Total3DHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), WidthBytesPhysical);
    }

    Total3DHeight = GFX_ALIGN(Total3DHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, WidthBytesPhysical, Total3DHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill3DTexOffsetAddress(pTexInfo);
    }

    GMM_DPF_EXIT;
    return (Status);
}